

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<std::pair<QByteArray,_QByteArray>_>::pop_back(QList<std::pair<QByteArray,_QByteArray>_> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  }
  QtPrivate::QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>::eraseLast
            ((QGenericArrayOps<std::pair<QByteArray,_QByteArray>_> *)this);
  return;
}

Assistant:

void pop_back() noexcept { removeLast(); }